

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O3

Vec_Int_t * Bmc_ManBCoreCollectPivots(Gia_Man_t *p,char *pName,Vec_Int_t *vVarMap)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *__ptr;
  long lVar5;
  int iVar6;
  long lVar7;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  __ptr = Bmc_ManBCoreReadPivots(pName);
  if (0 < p->nObjs) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pbVar1 = &p->pObjs->field_0x3 + lVar7;
      *pbVar1 = *pbVar1 & 0xbf;
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar5 < p->nObjs);
  }
  iVar3 = __ptr->nSize;
  if (0 < (long)iVar3) {
    piVar4 = __ptr->pArray;
    lVar5 = 0;
    do {
      iVar6 = piVar4[lVar5];
      if (((long)iVar6 < 1) || (p->nObjs <= iVar6)) {
        printf("Cannot find object with Id %d in the given AIG.\n");
      }
      else {
        *(ulong *)(p->pObjs + iVar6) = *(ulong *)(p->pObjs + iVar6) | 0x40000000;
      }
      lVar5 = lVar5 + 1;
    } while (iVar3 != lVar5);
  }
  iVar3 = vVarMap->nSize;
  if (1 < iVar3) {
    iVar6 = 1;
    lVar5 = 0;
    do {
      iVar2 = vVarMap->pArray[lVar5 * 2];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((p->pObjs[iVar2].field_0x3 & 0x40) != 0) {
        Vec_IntPush(p_00,(int)lVar5);
        iVar3 = vVarMap->nSize;
      }
      lVar5 = lVar5 + 1;
      iVar6 = iVar6 + 2;
    } while (iVar6 < iVar3);
  }
  if (0 < p->nObjs) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pbVar1 = &p->pObjs->field_0x3 + lVar5;
      *pbVar1 = *pbVar1 & 0xbf;
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar7 < p->nObjs);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return p_00;
}

Assistant:

Vec_Int_t * Bmc_ManBCoreCollectPivots( Gia_Man_t * p, char * pName, Vec_Int_t * vVarMap )
{
    Gia_Obj_t * pObj;
    int i, iVar, iFrame;
    Vec_Int_t * vPivots = Vec_IntAlloc( 100 );
    Vec_Int_t * vVars = Bmc_ManBCoreReadPivots( pName );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    Vec_IntForEachEntry( vVars, iVar, i )
        if ( iVar > 0 && iVar < Gia_ManObjNum(p) )
            Gia_ManObj( p, iVar )->fMark0 = 1;
        else
            printf( "Cannot find object with Id %d in the given AIG.\n", iVar );
    Vec_IntForEachEntryDouble( vVarMap, iVar, iFrame, i )
        if ( Gia_ManObj( p, iVar )->fMark0 )
            Vec_IntPush( vPivots, Abc_Lit2Var(i) );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    Vec_IntFree( vVars );
    return vPivots;
}